

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildHandler::ProcessBuffer
          (cmCTestBuildHandler *this,char *data,size_t length,size_t *tick,size_t tick_len,
          ostream *ofs,t_BuildProcessingQueueType *queue)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  reference pcVar4;
  pointer pcVar5;
  size_type sVar6;
  char *pcVar7;
  ostream *poVar8;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<char,_std::allocator<char>_> *this_01;
  cmCTestLogWrite local_8d8;
  string local_8c8 [32];
  cmCTestLogWrite local_8a8;
  undefined1 local_898 [8];
  ostringstream cmCTestLog_msg_2;
  string local_720 [32];
  ostringstream local_700 [8];
  ostringstream cmCTestLog_msg_1;
  string local_588 [32];
  ostringstream local_568 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_3e8 [4];
  int tickDisplayed;
  iterator local_3c8;
  _Self local_3a8;
  const_iterator local_388;
  iterator local_368;
  const_iterator local_348;
  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
  local_328;
  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
  local_320;
  cmCTestBuildErrorWarning *local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  reference local_2f0;
  string *pc;
  iterator __end4;
  iterator __begin4;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  undefined1 local_288 [7];
  bool found;
  cmCTestBuildErrorWarning errorwarning;
  _Self local_1b8;
  const_iterator local_198;
  iterator local_178;
  const_iterator local_158;
  int local_134;
  char *pcStack_130;
  int lineType;
  char *line;
  char *local_120;
  _Deque_iterator<char,_char_&,_char_*> local_118;
  iterator local_f8;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d8;
  const_iterator local_d0;
  iterator local_c8;
  iterator local_a8;
  iterator local_88;
  undefined1 local_68 [8];
  iterator it;
  char *ptr;
  size_type tick_line_len;
  ostream *ofs_local;
  size_t tick_len_local;
  size_t *tick_local;
  size_t length_local;
  char *data_local;
  cmCTestBuildHandler *this_local;
  
  for (it._M_node = (_Map_pointer)data; it._M_node < data + length;
      it._M_node = (_Map_pointer)((long)it._M_node + 1)) {
    std::deque<char,_std::allocator<char>_>::push_back(queue,(value_type *)it._M_node);
  }
  this->BuildOutputLogSize = length + this->BuildOutputLogSize;
  while( true ) {
    std::_Deque_iterator<char,_char_&,_char_*>::_Deque_iterator
              ((_Deque_iterator<char,_char_&,_char_*> *)local_68);
    std::deque<char,_std::allocator<char>_>::begin(&local_88,queue);
    local_68 = (undefined1  [8])local_88._M_cur;
    it._M_cur = local_88._M_first;
    it._M_first = local_88._M_last;
    it._M_last = (_Elt_pointer)local_88._M_node;
    while( true ) {
      std::deque<char,_std::allocator<char>_>::end(&local_a8,queue);
      bVar2 = std::operator!=((_Self *)local_68,&local_a8);
      if ((!bVar2) ||
         (pcVar4 = std::_Deque_iterator<char,_char_&,_char_*>::operator*
                             ((_Deque_iterator<char,_char_&,_char_*> *)local_68), *pcVar4 == '\n'))
      break;
      std::_Deque_iterator<char,_char_&,_char_*>::operator++
                ((_Deque_iterator<char,_char_&,_char_*> *)local_68);
    }
    if (this->MaxWarnings <= this->TotalWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->MaxErrors <= this->TotalErrors) {
      this->ErrorQuotaReached = true;
    }
    std::deque<char,_std::allocator<char>_>::end(&local_c8,queue);
    bVar2 = std::operator!=((_Self *)local_68,&local_c8);
    if (!bVar2) break;
    this_01 = &this->CurrentProcessingLine;
    std::vector<char,_std::allocator<char>_>::clear(this_01);
    local_d8._M_current = (char *)std::vector<char,_std::allocator<char>_>::end(this_01);
    __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
    __normal_iterator<char*>
              ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_d0,
               &local_d8);
    std::deque<char,_std::allocator<char>_>::begin(&local_f8,queue);
    std::_Deque_iterator<char,_char_&,_char_*>::_Deque_iterator
              (&local_118,(_Deque_iterator<char,_char_&,_char_*> *)local_68);
    local_120 = (char *)std::vector<char,std::allocator<char>>::
                        insert<std::_Deque_iterator<char,char&,char*>,void>
                                  ((vector<char,std::allocator<char>> *)this_01,local_d0,&local_f8,
                                   &local_118);
    line._7_1_ = 0;
    std::vector<char,_std::allocator<char>_>::push_back(this_01,(value_type *)((long)&line + 7));
    pcStack_130 = std::vector<char,_std::allocator<char>_>::data(this_01);
    local_134 = ProcessSingleLine(this,pcStack_130);
    std::deque<char,_std::allocator<char>_>::begin(&local_178,queue);
    std::_Deque_iterator<char,char_const&,char_const*>::
    _Deque_iterator<std::_Deque_iterator<char,char&,char*>,void>
              ((_Deque_iterator<char,char_const&,char_const*> *)&local_158,&local_178);
    std::operator+(&local_1b8,(_Deque_iterator<char,_char_&,_char_*> *)local_68,1);
    std::_Deque_iterator<char,char_const&,char_const*>::
    _Deque_iterator<std::_Deque_iterator<char,char&,char*>,void>
              ((_Deque_iterator<char,char_const&,char_const*> *)&local_198,&local_1b8);
    std::deque<char,_std::allocator<char>_>::erase
              ((iterator *)((long)&errorwarning.PostContext.field_2 + 8),queue,&local_158,&local_198
              );
    cmCTestBuildErrorWarning::cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_288);
    bVar2 = false;
    if (local_134 == 1) {
      this->LastTickChar = '*';
      local_288[0] = false;
      bVar2 = true;
      this->TotalWarnings = this->TotalWarnings + 1;
    }
    else if (local_134 == 2) {
      this->LastTickChar = '!';
      local_288[0] = true;
      bVar2 = true;
      this->TotalErrors = this->TotalErrors + 1;
    }
    if (bVar2) {
      register0x00000000 = (int)this->OutputLineCounter + 1;
      std::__cxx11::string::operator=((string *)&errorwarning,pcStack_130);
      std::__cxx11::string::clear();
      std::__cxx11::string::clear();
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::begin((iterator *)&__end4._M_node,&this->PreContext);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((iterator *)&pc,&this->PreContext);
      while (bVar2 = std::operator!=((_Self *)&__end4._M_node,(_Self *)&pc), bVar2) {
        local_2f0 = std::
                    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                    ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                                 *)&__end4._M_node);
        std::operator+(&local_310,local_2f0,"\n");
        std::__cxx11::string::operator+=((string *)&errorwarning.LineNumber,(string *)&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        std::
        _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      *)&__end4._M_node);
      }
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&this->PreContext);
      std::
      vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
      ::push_back(&this->ErrorsAndWarnings,(value_type *)local_288);
      local_320._M_current =
           (cmCTestBuildErrorWarning *)
           std::
           vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
           ::end(&this->ErrorsAndWarnings);
      local_318 = (cmCTestBuildErrorWarning *)
                  __gnu_cxx::
                  __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                  ::operator-(&local_320,1);
      (this->LastErrorOrWarning)._M_current = local_318;
      this->PostContextCount = 0;
    }
    else {
      bVar3 = std::
              vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
              ::empty(&this->ErrorsAndWarnings);
      bVar2 = false;
      if (!bVar3) {
        local_328._M_current =
             (cmCTestBuildErrorWarning *)
             std::
             vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
             ::end(&this->ErrorsAndWarnings);
        bVar3 = __gnu_cxx::operator!=(&this->LastErrorOrWarning,&local_328);
        bVar2 = false;
        if (bVar3) {
          bVar2 = this->PostContextCount < this->MaxPostContext;
        }
      }
      pcVar7 = pcStack_130;
      if (bVar2) {
        this->PostContextCount = this->PostContextCount + 1;
        pcVar5 = __gnu_cxx::
                 __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                 ::operator->(&this->LastErrorOrWarning);
        std::__cxx11::string::operator+=((string *)&pcVar5->PostContext,pcVar7);
        if (this->PostContextCount < this->MaxPostContext) {
          pcVar5 = __gnu_cxx::
                   __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                   ::operator->(&this->LastErrorOrWarning);
          std::__cxx11::string::operator+=((string *)&pcVar5->PostContext,"\n");
        }
      }
      else {
        std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&>
                  ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->PreContext,&stack0xfffffffffffffed0);
        sVar6 = std::
                deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->PreContext);
        if (this->MaxPreContext < sVar6) {
          this_00 = &this->PreContext;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin(&local_368,this_00);
          std::
          _Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
          ::
          _Deque_iterator<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>,void>
                    ((_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
                      *)&local_348,&local_368);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&local_3c8,this_00);
          std::operator-(&local_3a8,&local_3c8,this->MaxPreContext);
          std::
          _Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
          ::
          _Deque_iterator<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>,void>
                    ((_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
                      *)&local_388,&local_3a8);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase((iterator *)local_3e8,this_00,&local_348,&local_388);
        }
      }
    }
    this->OutputLineCounter = this->OutputLineCounter + 1;
    cmCTestBuildErrorWarning::~cmCTestBuildErrorWarning((cmCTestBuildErrorWarning *)local_288);
  }
  bVar2 = false;
  while (*tick * tick_len < this->BuildOutputLogSize) {
    *tick = *tick + 1;
    std::__cxx11::ostringstream::ostringstream(local_568);
    std::operator<<((ostream *)local_568,this->LastTickChar);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar7 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x422,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string(local_588);
    std::__cxx11::ostringstream::~ostringstream(local_568);
    bVar2 = true;
    if ((*tick % 0x32 == 0) && (*tick != 0)) {
      std::__cxx11::ostringstream::ostringstream(local_700);
      poVar8 = std::operator<<((ostream *)local_700,"  Size: ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->BuildOutputLogSize + 0x200 >> 10);
      poVar8 = std::operator<<(poVar8,"K");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::operator<<(poVar8,"    ");
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x42a,pcVar7,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string(local_720);
      std::__cxx11::ostringstream::~ostringstream(local_700);
    }
  }
  if (bVar2) {
    this->LastTickChar = '.';
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_898);
  cmCTestLogWrite::cmCTestLogWrite(&local_8a8,data,length);
  ::operator<<((ostream *)local_898,&local_8a8);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x433,pcVar7,false);
  std::__cxx11::string::~string(local_8c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_898);
  cmCTestLogWrite::cmCTestLogWrite(&local_8d8,data,length);
  ::operator<<(ofs,&local_8d8);
  return;
}

Assistant:

void cmCTestBuildHandler::ProcessBuffer(const char* data, size_t length,
                                        size_t& tick, size_t tick_len,
                                        std::ostream& ofs,
                                        t_BuildProcessingQueueType* queue)
{
  const std::string::size_type tick_line_len = 50;
  const char* ptr;
  for (ptr = data; ptr < data + length; ptr++) {
    queue->push_back(*ptr);
  }
  this->BuildOutputLogSize += length;

  // until there are any lines left in the buffer
  while (true) {
    // Find the end of line
    t_BuildProcessingQueueType::iterator it;
    for (it = queue->begin(); it != queue->end(); ++it) {
      if (*it == '\n') {
        break;
      }
    }

    // Once certain number of errors or warnings reached, ignore future errors
    // or warnings.
    if (this->TotalWarnings >= this->MaxWarnings) {
      this->WarningQuotaReached = true;
    }
    if (this->TotalErrors >= this->MaxErrors) {
      this->ErrorQuotaReached = true;
    }

    // If the end of line was found
    if (it != queue->end()) {
      // Create a contiguous array for the line
      this->CurrentProcessingLine.clear();
      this->CurrentProcessingLine.insert(this->CurrentProcessingLine.end(),
                                         queue->begin(), it);
      this->CurrentProcessingLine.push_back(0);
      const char* line = this->CurrentProcessingLine.data();

      // Process the line
      int lineType = this->ProcessSingleLine(line);

      // Erase the line from the queue
      queue->erase(queue->begin(), it + 1);

      // Depending on the line type, produce error or warning, or nothing
      cmCTestBuildErrorWarning errorwarning;
      bool found = false;
      switch (lineType) {
        case b_WARNING_LINE:
          this->LastTickChar = '*';
          errorwarning.Error = false;
          found = true;
          this->TotalWarnings++;
          break;
        case b_ERROR_LINE:
          this->LastTickChar = '!';
          errorwarning.Error = true;
          found = true;
          this->TotalErrors++;
          break;
      }
      if (found) {
        // This is an error or warning, so generate report
        errorwarning.LogLine = static_cast<int>(this->OutputLineCounter + 1);
        errorwarning.Text = line;
        errorwarning.PreContext.clear();
        errorwarning.PostContext.clear();

        // Copy pre-context to report
        for (std::string const& pc : this->PreContext) {
          errorwarning.PreContext += pc + "\n";
        }
        this->PreContext.clear();

        // Store report
        this->ErrorsAndWarnings.push_back(std::move(errorwarning));
        this->LastErrorOrWarning = this->ErrorsAndWarnings.end() - 1;
        this->PostContextCount = 0;
      } else {
        // This is not an error or warning.
        // So, figure out if this is a post-context line
        if (!this->ErrorsAndWarnings.empty() &&
            this->LastErrorOrWarning != this->ErrorsAndWarnings.end() &&
            this->PostContextCount < this->MaxPostContext) {
          this->PostContextCount++;
          this->LastErrorOrWarning->PostContext += line;
          if (this->PostContextCount < this->MaxPostContext) {
            this->LastErrorOrWarning->PostContext += "\n";
          }
        } else {
          // Otherwise store pre-context for the next error
          this->PreContext.emplace_back(line);
          if (this->PreContext.size() > this->MaxPreContext) {
            this->PreContext.erase(this->PreContext.begin(),
                                   this->PreContext.end() -
                                     this->MaxPreContext);
          }
        }
      }
      this->OutputLineCounter++;
    } else {
      break;
    }
  }

  // Now that the buffer is processed, display missing ticks
  int tickDisplayed = false;
  while (this->BuildOutputLogSize > (tick * tick_len)) {
    tick++;
    cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                       this->LastTickChar, this->Quiet);
    tickDisplayed = true;
    if (tick % tick_line_len == 0 && tick > 0) {
      cmCTestOptionalLog(this->CTest, HANDLER_PROGRESS_OUTPUT,
                         "  Size: "
                           << ((this->BuildOutputLogSize + 512) / 1024) << "K"
                           << std::endl
                           << "    ",
                         this->Quiet);
    }
  }
  if (tickDisplayed) {
    this->LastTickChar = '.';
  }

  // And if this is verbose output, display the content of the chunk
  cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
             cmCTestLogWrite(data, length));

  // Always store the chunk to the file
  ofs << cmCTestLogWrite(data, length);
}